

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O2

void __thiscall amrex::MLABecLaplacian::setACoeffs(MLABecLaplacian *this,int amrlev,MultiFab *alpha)

{
  if ((alpha->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp != 1) {
    Assert_host("alpha.nComp() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLABecLaplacian.cpp"
                ,0x7d,"\"MLABecLaplacian::setACoeffs: alpha is supposed to be single component.\"");
  }
  MultiFab::Copy(*(MultiFab **)
                  &(this->m_a_coeffs).
                   super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[amrlev].
                   super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                   super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,alpha,0,0,1
                 ,0);
  this->m_needs_update = true;
  return;
}

Assistant:

void
MLABecLaplacian::setACoeffs (int amrlev, const MultiFab& alpha)
{
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(alpha.nComp() == 1,
                                     "MLABecLaplacian::setACoeffs: alpha is supposed to be single component.");
    MultiFab::Copy(m_a_coeffs[amrlev][0], alpha, 0, 0, 1, 0);
    m_needs_update = true;
}